

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLURL.cpp
# Opt level: O3

bool __thiscall xercesc_4_0::XMLURL::isRelative(XMLURL *this)

{
  bool bVar1;
  
  bVar1 = true;
  if ((this->fProtocol != Unknown) && (this->fPath != (XMLCh *)0x0)) {
    bVar1 = *this->fPath != L'/';
  }
  return bVar1;
}

Assistant:

bool XMLURL::isRelative() const
{
    // If no protocol then relative
    if (fProtocol == Unknown)
        return true;

    // If no path, or the path is not absolute, then relative
    if (!fPath)
        return true;

    if (*fPath != chForwardSlash)
        return true;

    return false;
}